

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall CompressedArray::const_iterator::read_value(const_iterator *this)

{
  uint32_t uVar1;
  uint *puVar2;
  long in_RDI;
  const_iterator *unaff_retaddr;
  uint32_t index;
  undefined4 in_stack_fffffffffffffff0;
  long lVar3;
  uint32_t log_radix;
  
  lVar3 = in_RDI;
  uVar1 = read_number(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  log_radix = (uint32_t)((ulong)lVar3 >> 0x20);
  puVar2 = Vocabulary<unsigned_int>::operator[]
                     ((Vocabulary<unsigned_int> *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                      (uint32_t)((ulong)in_RDI >> 0x20));
  *(uint *)(in_RDI + 0x20) = *puVar2;
  uVar1 = read_number(unaff_retaddr,log_radix);
  puVar2 = Vocabulary<unsigned_int>::operator[]
                     ((Vocabulary<unsigned_int> *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                      (uint32_t)((ulong)in_RDI >> 0x20));
  *(uint *)(in_RDI + 0x24) = *puVar2;
  uVar1 = read_number(unaff_retaddr,log_radix);
  puVar2 = Vocabulary<unsigned_int>::operator[]
                     ((Vocabulary<unsigned_int> *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                      (uint32_t)((ulong)in_RDI >> 0x20));
  *(uint *)(in_RDI + 0x28) = *puVar2;
  return;
}

Assistant:

void CompressedArray::const_iterator::read_value() {
    uint32_t index = read_number(array->ngram_count_index_log_radix);
    record.value.ngram_count = array->ngram_count_values[index];
    index = read_number(array->continuations_count_index_log_radix);
    record.value.continuations_count = array->continuations_count_values[index];
    index = read_number(array->unique_continuations_count_index_log_radix);
    record.value.unique_continuations_count = array->unique_continuations_count_values[index];
}